

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O1

void __thiscall
booster::intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_>::
~intrusive_ptr(intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_>
               *this)

{
  callable<void_(cppcms::http::context::completion_type)> *pcVar1;
  long lVar2;
  
  pcVar1 = this->p_;
  if (pcVar1 != (callable<void_(cppcms::http::context::completion_type)> *)0x0) {
    lVar2 = booster::atomic_counter::dec();
    if (lVar2 == 0) {
      (*(pcVar1->super_refcounted)._vptr_refcounted[1])(pcVar1);
      return;
    }
  }
  return;
}

Assistant:

~intrusive_ptr()
    {
        if(p_ != 0) intrusive_ptr_release(p_);
    }